

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.h
# Opt level: O0

bool __thiscall LOTKeyPath::propagate(LOTKeyPath *this,string *key,uint32_t depth)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint in_EDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *in_stack_ffffffffffffffc8;
  LOTKeyPath *in_stack_ffffffffffffffd0;
  undefined1 local_22;
  undefined1 local_21;
  
  bVar1 = skip(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    local_21 = true;
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_EDX;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             size((LOTKeyPath *)0x165cb2);
    local_22 = true;
    if (pbVar2 <= __lhs) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,(ulong)in_EDX);
      local_22 = std::operator==(__lhs,(char *)in_stack_ffffffffffffffc8);
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool propagate(const std::string key, uint32_t depth)
    {
        return skip(key) ? true : (depth < size()) || (mKeys[depth] == "**");
    }